

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::multiply(bigint *this,uint32_t value)

{
  size_t sVar1;
  uint *puVar2;
  long lVar3;
  uint in_ESI;
  buffer<unsigned_int> *in_RDI;
  double_bigit result;
  size_t n;
  size_t i;
  double_bigit wide_value;
  bigit carry;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined8 local_20;
  undefined4 local_10;
  
  local_10 = 0;
  local_20 = 0;
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  for (; local_20 < sVar1; local_20 = local_20 + 1) {
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>(in_RDI,local_20);
    lVar3 = (ulong)*puVar2 * (ulong)in_ESI + (ulong)local_10;
    in_stack_ffffffffffffffc4 = (uint)lVar3;
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>(in_RDI,local_20);
    *puVar2 = in_stack_ffffffffffffffc4;
    local_10 = (uint)((ulong)lVar3 >> 0x20);
  }
  if (local_10 != 0) {
    buffer<unsigned_int>::push_back
              ((buffer<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
               ,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void multiply(uint32_t value) {
    bigit carry = 0;
    const double_bigit wide_value = value;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * wide_value + carry;
      bigits_[i] = static_cast<bigit>(result);
      carry = static_cast<bigit>(result >> bigit_bits);
    }
    if (carry != 0) bigits_.push_back(carry);
  }